

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5PorterCreate(void *pCtx,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  int iVar1;
  Fts5Tokenizer *__s;
  Fts5Tokenizer *pFVar2;
  char **ppcVar3;
  char *pcVar4;
  char **ppcVar5;
  PorterTokenizer *p;
  void *pUserdata;
  undefined8 local_38;
  
  local_38 = 0;
  if (nArg < 1) {
    pcVar4 = "unicode61";
  }
  else {
    pcVar4 = *azArg;
  }
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    __s = (Fts5Tokenizer *)sqlite3Malloc(0xa0);
  }
  else {
    __s = (Fts5Tokenizer *)0x0;
  }
  if (__s == (Fts5Tokenizer *)0x0) {
    iVar1 = 7;
  }
  else {
    memset(__s,0,0xa0);
    iVar1 = (**(code **)((long)pCtx + 0x10))(pCtx,pcVar4,&local_38,__s);
  }
  if (iVar1 == 0) {
    ppcVar3 = (char **)(ulong)(nArg - 1);
    if (nArg < 1) {
      ppcVar3 = (char **)0x0;
    }
    ppcVar5 = (char **)0x0;
    if ((int)ppcVar3 != 0) {
      ppcVar5 = azArg + 1;
    }
    iVar1 = (**(code **)__s)(local_38,ppcVar5,ppcVar3,__s + 0x18);
  }
  pFVar2 = (Fts5Tokenizer *)0x0;
  if (iVar1 == 0) {
    pFVar2 = __s;
  }
  if ((__s != (Fts5Tokenizer *)0x0) && (iVar1 != 0)) {
    if (*(long *)(__s + 0x18) != 0) {
      (**(code **)(__s + 8))();
    }
    sqlite3_free(__s);
    pFVar2 = (Fts5Tokenizer *)0x0;
  }
  *ppOut = pFVar2;
  return iVar1;
}

Assistant:

static int fts5PorterCreate(
  void *pCtx, 
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  fts5_api *pApi = (fts5_api*)pCtx;
  int rc = SQLITE_OK;
  PorterTokenizer *pRet;
  void *pUserdata = 0;
  const char *zBase = "unicode61";

  if( nArg>0 ){
    zBase = azArg[0];
  }

  pRet = (PorterTokenizer*)sqlite3_malloc(sizeof(PorterTokenizer));
  if( pRet ){
    memset(pRet, 0, sizeof(PorterTokenizer));
    rc = pApi->xFindTokenizer(pApi, zBase, &pUserdata, &pRet->tokenizer);
  }else{
    rc = SQLITE_NOMEM;
  }
  if( rc==SQLITE_OK ){
    int nArg2 = (nArg>0 ? nArg-1 : 0);
    const char **azArg2 = (nArg2 ? &azArg[1] : 0);
    rc = pRet->tokenizer.xCreate(pUserdata, azArg2, nArg2, &pRet->pTokenizer);
  }

  if( rc!=SQLITE_OK ){
    fts5PorterDelete((Fts5Tokenizer*)pRet);
    pRet = 0;
  }
  *ppOut = (Fts5Tokenizer*)pRet;
  return rc;
}